

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int mbedtls_ctr_drbg_seed
              (mbedtls_ctr_drbg_context *ctx,mbedtls_ssl_recv_t *f_entropy,void *p_entropy,
              uchar *custom,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong nonce_len;
  size_t sVar3;
  uchar auStack_58 [8];
  uchar key [32];
  
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  auStack_58[0] = '\0';
  auStack_58[1] = '\0';
  auStack_58[2] = '\0';
  auStack_58[3] = '\0';
  auStack_58[4] = '\0';
  auStack_58[5] = '\0';
  auStack_58[6] = '\0';
  auStack_58[7] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  ctx->f_entropy = f_entropy;
  ctx->p_entropy = p_entropy;
  sVar3 = ctx->entropy_len;
  if (sVar3 == 0) {
    ctx->entropy_len = 0x20;
    sVar3 = 0x20;
  }
  uVar1 = ctx->reseed_counter;
  iVar2 = mbedtls_aes_setkey_enc(&ctx->aes_ctx,auStack_58,0x100);
  if (iVar2 == 0) {
    nonce_len = 0;
    if (sVar3 < 0x30) {
      nonce_len = sVar3 + 1 >> 1;
    }
    if (-1 < (int)uVar1) {
      nonce_len = (ulong)uVar1;
    }
    iVar2 = mbedtls_ctr_drbg_reseed_internal(ctx,custom,len,nonce_len);
  }
  return iVar2;
}

Assistant:

int mbedtls_ctr_drbg_seed(mbedtls_ctr_drbg_context *ctx,
                          int (*f_entropy)(void *, unsigned char *, size_t),
                          void *p_entropy,
                          const unsigned char *custom,
                          size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    size_t nonce_len;

    memset(key, 0, MBEDTLS_CTR_DRBG_KEYSIZE);

    /* The mutex is initialized iff f_entropy is set. */
#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init(&ctx->mutex);
#endif

    ctx->f_entropy = f_entropy;
    ctx->p_entropy = p_entropy;

    if (ctx->entropy_len == 0) {
        ctx->entropy_len = MBEDTLS_CTR_DRBG_ENTROPY_LEN;
    }
    /* ctx->reseed_counter contains the desired amount of entropy to
     * grab for a nonce (see mbedtls_ctr_drbg_set_nonce_len()).
     * If it's -1, indicating that the entropy nonce length was not set
     * explicitly, use a sufficiently large nonce for security. */
    nonce_len = (ctx->reseed_counter >= 0 ?
                 (size_t) ctx->reseed_counter :
                 good_nonce_len(ctx->entropy_len));

    /* Initialize with an empty key. */
    if ((ret = mbedtls_aes_setkey_enc(&ctx->aes_ctx, key,
                                      MBEDTLS_CTR_DRBG_KEYBITS)) != 0) {
        return ret;
    }

    /* Do the initial seeding. */
    if ((ret = mbedtls_ctr_drbg_reseed_internal(ctx, custom, len,
                                                nonce_len)) != 0) {
        return ret;
    }
    return 0;
}